

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aead80pq_inplace.c
# Opt level: O1

void test_aead80pq_inplace(void)

{
  _Bool _Var1;
  vecs_err_t vVar2;
  int iVar3;
  size_t sVar4;
  byte bVar5;
  undefined8 uVar6;
  uint8_t *puVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  bool bVar11;
  _Bool local_199;
  vecs_ctx_t ctx;
  vecs_ctx_t ctx_1;
  vecs_aead_t testcase;
  uint8_t obtained_tag [16];
  uint8_t transformed [32];
  byte local_50;
  
  puts("Testing Ascon-80pq en/decryption in-place...");
  vVar2 = vecs_init(&ctx,"vectors/aead80pq.txt",0x14);
  if (vVar2 == VECS_OK) {
    do {
      vVar2 = vecs_aead_next(&ctx,&testcase);
      sVar4 = testcase.plaintext_len;
      if (vVar2 == VECS_EOF) goto LAB_0010ef90;
      atto_counter = testcase.count;
      if (vVar2 != VECS_OK) {
        uVar6 = 0x23;
        goto LAB_0010ef7f;
      }
      if (testcase.plaintext_len != testcase.ciphertext_len) {
        uVar6 = 0x24;
        goto LAB_0010ef7f;
      }
      memcpy(transformed,testcase.plaintext,testcase.plaintext_len);
      ascon_aead80pq_encrypt
                (transformed,(uint8_t *)&ctx_1,testcase.key,testcase.nonce,testcase.assoc_data,
                 transformed,testcase.assoc_data_len,sVar4,0x10);
      vecs_aead_enc_log(&testcase,transformed,(uint8_t *)&ctx_1,testcase.ciphertext_len);
      sVar4 = testcase.ciphertext_len;
      iVar3 = bcmp(transformed,testcase.ciphertext,testcase.ciphertext_len);
      if (iVar3 != 0) {
        uVar6 = 0x35;
        goto LAB_0010ef7f;
      }
      if (ctx_1 != (vecs_ctx_t)testcase.tag) {
        uVar6 = 0x36;
        goto LAB_0010ef7f;
      }
      _Var1 = ascon_aead80pq_decrypt
                        (transformed,testcase.key,testcase.nonce,testcase.assoc_data,transformed,
                         (uint8_t *)&ctx_1,testcase.assoc_data_len,sVar4,0x10);
      vecs_aead_dec_log(&testcase,transformed,testcase.plaintext_len);
      if (!_Var1) {
        uVar6 = 0x45;
        goto LAB_0010ef7f;
      }
      iVar3 = bcmp(transformed,testcase.plaintext,testcase.plaintext_len);
    } while (iVar3 == 0);
    uVar6 = 0x48;
  }
  else {
    uVar6 = 0x19;
  }
LAB_0010ef7f:
  printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
         "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead80pq_inplace.c"
         ,uVar6,"test_inplace_offline",atto_counter);
  atto_at_least_one_fail = '\x01';
LAB_0010ef90:
  vVar2 = vecs_init(&ctx_1,"vectors/aead80pq.txt",0x14);
  if (vVar2 == VECS_OK) {
    vVar2 = vecs_aead_next(&ctx_1,&testcase);
    if (vVar2 != VECS_EOF) {
      do {
        atto_counter = testcase.count;
        if (vVar2 != VECS_OK) {
          uVar6 = 0x61;
          goto LAB_0010efd2;
        }
        if (testcase.plaintext_len != testcase.ciphertext_len) {
          uVar6 = 0x62;
          goto LAB_0010efd2;
        }
        memcpy(&ctx,testcase.plaintext,testcase.plaintext_len);
        ascon_aead80pq_init((ascon_aead_ctx_t *)transformed,testcase.key,testcase.nonce);
        bVar9 = 1;
        puVar7 = testcase.assoc_data;
        uVar10 = 0;
        while (uVar10 < testcase.assoc_data_len) {
          ascon_aead80pq_assoc_data_update((ascon_aead_ctx_t *)transformed,puVar7,1);
          uVar10 = uVar10 + 1;
          bVar5 = bVar9 & 7;
          bVar9 = bVar9 + 1;
          puVar7 = puVar7 + 1;
          if (bVar5 != local_50) {
            uVar6 = 0x6b;
            goto LAB_0010efd2;
          }
        }
        bVar11 = testcase.plaintext_len != 0;
        if (testcase.plaintext_len == 0) {
          lVar8 = 0;
        }
        else {
          uVar10 = 0;
          lVar8 = 0;
          do {
            sVar4 = ascon_aead80pq_encrypt_update
                              ((ascon_aead_ctx_t *)transformed,
                               (uint8_t *)((long)&ctx.handle + lVar8),
                               (uint8_t *)((long)&ctx.handle + uVar10),1);
            lVar8 = lVar8 + sVar4;
            uVar10 = uVar10 + 1;
            if (((uint)uVar10 & 7) != (uint)local_50) {
              uVar6 = 0x75;
LAB_0010f2a4:
              printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead80pq_inplace.c"
                     ,uVar6,"test_inplace_update_single_byte",atto_counter);
              atto_at_least_one_fail = '\x01';
              break;
            }
            if (local_50 == 0) {
              if (sVar4 != 8) {
                uVar6 = 0x78;
                goto LAB_0010f2a4;
              }
            }
            else if (sVar4 != 0) {
              uVar6 = 0x7c;
              goto LAB_0010f2a4;
            }
            bVar11 = uVar10 < testcase.plaintext_len;
          } while (bVar11);
        }
        if (bVar11) {
          return;
        }
        sVar4 = ascon_aead80pq_encrypt_final
                          ((ascon_aead_ctx_t *)transformed,(uint8_t *)((long)&ctx.handle + lVar8),
                           obtained_tag,0x10);
        if (7 < sVar4) {
          uVar6 = 0x85;
          goto LAB_0010efd2;
        }
        if (sVar4 != ((uint)testcase.ciphertext_len & 7)) {
          uVar6 = 0x86;
          goto LAB_0010efd2;
        }
        if (sVar4 + lVar8 != testcase.ciphertext_len) {
          uVar6 = 0x87;
          goto LAB_0010efd2;
        }
        vecs_aead_enc_log(&testcase,(uint8_t *)&ctx,obtained_tag,testcase.ciphertext_len);
        iVar3 = bcmp(&ctx,testcase.ciphertext,testcase.ciphertext_len);
        if (iVar3 != 0) {
          uVar6 = 0x8c;
          goto LAB_0010efd2;
        }
        if (obtained_tag != testcase.tag) {
          uVar6 = 0x8d;
          goto LAB_0010efd2;
        }
        lVar8 = 0;
        do {
          if (transformed[lVar8] != '\0') {
            uVar6 = 0x8e;
            goto LAB_0010efd2;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x58);
        ascon_aead80pq_init((ascon_aead_ctx_t *)transformed,testcase.key,testcase.nonce);
        bVar9 = 1;
        puVar7 = testcase.assoc_data;
        uVar10 = 0;
        while (uVar10 < testcase.assoc_data_len) {
          ascon_aead80pq_assoc_data_update((ascon_aead_ctx_t *)transformed,puVar7,1);
          uVar10 = uVar10 + 1;
          bVar5 = bVar9 & 7;
          bVar9 = bVar9 + 1;
          puVar7 = puVar7 + 1;
          if (bVar5 != local_50) {
            uVar6 = 0x97;
            goto LAB_0010efd2;
          }
        }
        bVar11 = testcase.ciphertext_len != 0;
        if (testcase.ciphertext_len == 0) {
          lVar8 = 0;
        }
        else {
          uVar10 = 0;
          lVar8 = 0;
          do {
            sVar4 = ascon_aead80pq_decrypt_update
                              ((ascon_aead_ctx_t *)transformed,
                               (uint8_t *)((long)&ctx.handle + lVar8),
                               (uint8_t *)((long)&ctx.handle + uVar10),1);
            lVar8 = lVar8 + sVar4;
            uVar10 = uVar10 + 1;
            if (((uint)uVar10 & 7) != (uint)local_50) {
              uVar6 = 0xa1;
LAB_0010f465:
              printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead80pq_inplace.c"
                     ,uVar6,"test_inplace_update_single_byte",atto_counter);
              atto_at_least_one_fail = '\x01';
              break;
            }
            if (local_50 == 0) {
              if (sVar4 != 8) {
                uVar6 = 0xa4;
                goto LAB_0010f465;
              }
            }
            else if (sVar4 != 0) {
              uVar6 = 0xa8;
              goto LAB_0010f465;
            }
            bVar11 = uVar10 < testcase.ciphertext_len;
          } while (bVar11);
        }
        if (bVar11) {
          return;
        }
        sVar4 = ascon_aead80pq_decrypt_final
                          ((ascon_aead_ctx_t *)transformed,(uint8_t *)((long)&ctx.handle + lVar8),
                           &local_199,testcase.tag,0x10);
        if (7 < sVar4) {
          uVar6 = 0xb0;
          goto LAB_0010efd2;
        }
        if (sVar4 != ((uint)testcase.plaintext_len & 7)) {
          uVar6 = 0xb1;
          goto LAB_0010efd2;
        }
        if (sVar4 + lVar8 != testcase.plaintext_len) {
          uVar6 = 0xb2;
          goto LAB_0010efd2;
        }
        vecs_aead_dec_log(&testcase,(uint8_t *)&ctx,testcase.plaintext_len);
        if (local_199 == false) {
          uVar6 = 0xb4;
          goto LAB_0010efd2;
        }
        iVar3 = bcmp(&ctx,testcase.plaintext,testcase.plaintext_len);
        if (iVar3 != 0) {
          uVar6 = 0xb7;
          goto LAB_0010efd2;
        }
        lVar8 = 0;
        do {
          if (transformed[lVar8] != '\0') {
            uVar6 = 0xb8;
            goto LAB_0010efd2;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x58);
        vVar2 = vecs_aead_next(&ctx_1,&testcase);
      } while (vVar2 != VECS_EOF);
    }
  }
  else {
    uVar6 = 0x53;
LAB_0010efd2:
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead80pq_inplace.c"
           ,uVar6,"test_inplace_update_single_byte",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  return;
}

Assistant:

void test_aead80pq_inplace(void)
{
    puts("Testing Ascon-80pq en/decryption in-place...");
    test_inplace_offline();
    test_inplace_update_single_byte();
}